

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxDebug.cpp
# Opt level: O3

void Diligent::LinuxDebug::OutputDebugMessage
               (DEBUG_MESSAGE_SEVERITY Severity,Char *Message,char *Function,char *File,int Line,
               TextColor Color)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  String msg;
  int in_stack_ffffffffffffffc8;
  String local_30;
  
  BasicPlatformDebug::FormatDebugMessage_abi_cxx11_
            (&local_30,(BasicPlatformDebug *)(ulong)Severity,(DEBUG_MESSAGE_SEVERITY)Message,
             Function,File,(char *)(ulong)(uint)Line,in_stack_ffffffffffffffc8);
  __s = BasicPlatformDebug::TextColorToTextColorCode(Severity,Color);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0xb80320);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\x1b[39m",5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LinuxDebug::OutputDebugMessage(DEBUG_MESSAGE_SEVERITY Severity,
                                    const Char*            Message,
                                    const char*            Function,
                                    const char*            File,
                                    int                    Line,
                                    TextColor              Color)
{
    auto msg = FormatDebugMessage(Severity, Message, Function, File, Line);

    const auto* ColorCode = TextColorToTextColorCode(Severity, Color);
    std::cout << ColorCode << msg << TextColorCode::Default;
}